

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O3

void fio_pubsub_detach(fio_pubsub_engine_s *engine)

{
  fio_engine_set__ordered_s_ *pfVar1;
  uintptr_t *puVar2;
  fio_engine_set__map_s_ *pfVar3;
  fio_pubsub_engine_s *in_RDX;
  fio_pubsub_engine_s *extraout_RDX;
  fio_engine_set__ordered_s_ *pfVar4;
  fio_lock_i ret;
  timespec local_28;
  
  LOCK();
  UNLOCK();
  local_28.tv_sec = CONCAT71(local_28.tv_sec._1_7_,fio_postoffice.engines.lock);
  if (fio_postoffice.engines.lock != '\0') {
    do {
      fio_postoffice.engines.lock = '\x01';
      local_28.tv_sec = 0;
      local_28.tv_nsec = 1;
      nanosleep(&local_28,(timespec *)0x0);
      LOCK();
      UNLOCK();
      local_28.tv_sec = CONCAT71(local_28.tv_sec._1_7_,fio_postoffice.engines.lock);
      in_RDX = extraout_RDX;
    } while (fio_postoffice.engines.lock != '\0');
  }
  fio_postoffice.engines.lock = '\x01';
  if (((engine != (fio_pubsub_engine_s *)0x0) &&
      (pfVar3 = fio_engine_set__find_map_pos_((fio_engine_set_s *)engine,(uintptr_t)engine,in_RDX),
      pfVar3 != (fio_engine_set__map_s_ *)0x0)) &&
     (pfVar1 = pfVar3->pos, pfVar1 != (fio_engine_set__ordered_s_ *)0x0)) {
    fio_postoffice.engines.set.count = fio_postoffice.engines.set.count - 1;
    pfVar1->hash = 0;
    pfVar4 = fio_postoffice.engines.set.ordered;
    if (pfVar1 == fio_postoffice.engines.set.ordered + (fio_postoffice.engines.set.pos - 1)) {
      pfVar3->hash = 0;
      pfVar4 = pfVar4 + (fio_postoffice.engines.set.pos - 2);
      do {
        fio_postoffice.engines.set.pos = fio_postoffice.engines.set.pos - 1;
        if (fio_postoffice.engines.set.pos == 0) break;
        puVar2 = &pfVar4->hash;
        pfVar4 = pfVar4 + -1;
      } while (*puVar2 == 0);
    }
    pfVar3->pos = (fio_engine_set__ordered_s_ *)0x0;
  }
  LOCK();
  fio_postoffice.engines.lock = '\0';
  UNLOCK();
  return;
}

Assistant:

void fio_pubsub_detach(fio_pubsub_engine_s *engine) {
  fio_lock(&fio_postoffice.engines.lock);
  fio_engine_set_remove(&fio_postoffice.engines.set, (uintptr_t)engine, engine,
                        NULL);
  fio_unlock(&fio_postoffice.engines.lock);
}